

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

UChar * __thiscall
icu_63::Normalizer2Impl::copyLowPrefixFromNulTerminated
          (Normalizer2Impl *this,UChar *src,UChar32 minNeedDataCP,ReorderingBuffer *buffer,
          UErrorCode *errorCode)

{
  long lVar1;
  long lVar2;
  UChar *prevSrc;
  
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (*(ushort *)((long)src + lVar2) == 0) break;
    lVar1 = lVar2 + 2;
  } while ((int)(uint)*(ushort *)((long)src + lVar2) < minNeedDataCP);
  if (buffer != (ReorderingBuffer *)0x0 && lVar2 + 2 != 2) {
    ReorderingBuffer::appendZeroCC(buffer,src,(UChar *)((long)src + lVar2),errorCode);
  }
  return (UChar *)((long)src + lVar2);
}

Assistant:

const UChar *
Normalizer2Impl::copyLowPrefixFromNulTerminated(const UChar *src,
                                                UChar32 minNeedDataCP,
                                                ReorderingBuffer *buffer,
                                                UErrorCode &errorCode) const {
    // Make some effort to support NUL-terminated strings reasonably.
    // Take the part of the fast quick check loop that does not look up
    // data and check the first part of the string.
    // After this prefix, determine the string length to simplify the rest
    // of the code.
    const UChar *prevSrc=src;
    UChar c;
    while((c=*src++)<minNeedDataCP && c!=0) {}
    // Back out the last character for full processing.
    // Copy this prefix.
    if(--src!=prevSrc) {
        if(buffer!=NULL) {
            buffer->appendZeroCC(prevSrc, src, errorCode);
        }
    }
    return src;
}